

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cea708.c
# Opt level: O1

int cea708_init(cea708_t *cea708,double timestamp)

{
  memset(cea708,0,0xa0);
  cea708->country = country_united_states;
  cea708->provider = t35_provider_atsc;
  cea708->user_identifier = 0x47413934;
  cea708->user_data_type_code = '\x03';
  cea708->directv_user_data_length = '\0';
  *(undefined2 *)&cea708->user_data = 0xff02;
  cea708->timestamp = timestamp;
  return 1;
}

Assistant:

int cea708_init(cea708_t* cea708, double timestamp)
{
    memset(cea708, 0, sizeof(cea708_t));
    cea708->country = country_united_states;
    cea708->provider = t35_provider_atsc;
    cea708->user_identifier = GA94;
    cea708->user_data_type_code = 3;
    cea708->directv_user_data_length = 0;
    cea708->user_data.process_em_data_flag = 0;
    cea708->user_data.process_cc_data_flag = 1;
    cea708->user_data.additional_data_flag = 0;
    cea708->user_data.em_data = 0xFF;
    cea708->user_data.cc_count = 0;
    cea708->timestamp = timestamp;
    return 1;
}